

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundImpDirWrapper.cpp
# Opt level: O2

bool __thiscall BoundImpDirWrapper::wrap(BoundImpDirWrapper *this)

{
  size_t sVar1;
  int iVar2;
  IMAGE_DATA_DIRECTORY *pIVar3;
  size_t sVar4;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  sVar1 = this->importsCount;
  this->importsCount = 0;
  pIVar3 = DataDirEntryWrapper::getDataDirectory(&this->super_DataDirEntryWrapper);
  if (pIVar3 == (IMAGE_DATA_DIRECTORY *)0x0) {
    sVar4 = this->importsCount;
  }
  else {
    sVar4 = 0xffffffffffffffff;
    do {
      sVar4 = sVar4 + 1;
      iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2e])
                        (this,sVar4);
    } while ((char)iVar2 != '\0');
    this->importsCount = sVar4;
  }
  return sVar1 != sVar4;
}

Assistant:

bool BoundImpDirWrapper::wrap()
{
    clear();
    size_t oldCount = this->importsCount;
    this->importsCount = 0;

    if (!getDataDirectory()) {
        return (oldCount != this->importsCount); //has count changed
    }

    size_t cntr = 0;
    while (loadNextEntry(cntr)) {
        cntr++;
    }

    this->importsCount = cntr;
    return (oldCount != this->importsCount); //has count changed
}